

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O2

void Ivy_FastMapPerform(Ivy_Man_t *pAig,int nLimit,int fRecovery,int fVerbose)

{
  char cVar1;
  ushort uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  abctime aVar9;
  int *piVar10;
  void *pvVar11;
  undefined8 *puVar12;
  abctime aVar13;
  Ivy_Obj_t *pIVar14;
  int *piVar15;
  Ivy_Supp_t *pIVar16;
  abctime aVar17;
  ushort uVar18;
  short sVar19;
  int iVar20;
  int *piVar21;
  int fSetInter;
  int fSetInter_00;
  int fSetInter_01;
  long lVar22;
  int iVar23;
  undefined4 uVar24;
  Ivy_Supp_t *pSupp1;
  char *in_R8;
  long lVar25;
  Ivy_Supp_t *pIVar26;
  Ivy_Supp_t *pIVar27;
  long lVar28;
  Ivy_Supp_t *pIVar29;
  
  aVar9 = Abc_Clock();
  piVar10 = (int *)calloc(1,0x20);
  *piVar10 = nLimit;
  iVar23 = pAig->vObjs->nSize;
  piVar10[1] = iVar23;
  iVar20 = nLimit * 4 + 0xc;
  piVar10[2] = iVar20;
  pvVar11 = calloc(1,(long)(iVar23 * iVar20));
  *(void **)(piVar10 + 4) = pvVar11;
  puVar12 = (undefined8 *)malloc(0x10);
  *puVar12 = 100;
  pvVar11 = malloc(800);
  puVar12[1] = pvVar11;
  *(undefined8 **)(piVar10 + 6) = puVar12;
  pAig->pData = piVar10;
  aVar13 = Abc_Clock();
  Ivy_ObjSuppStart(pAig,pAig->pConst1);
  for (iVar23 = 0; iVar23 < pAig->vPis->nSize; iVar23 = iVar23 + 1) {
    pIVar14 = (Ivy_Obj_t *)Vec_PtrEntry(pAig->vPis,iVar23);
    Ivy_ObjSuppStart(pAig,pIVar14);
  }
  for (iVar23 = 0; iVar23 < pAig->vObjs->nSize; iVar23 = iVar23 + 1) {
    piVar15 = (int *)Vec_PtrEntry(pAig->vObjs,iVar23);
    if ((piVar15 != (int *)0x0) && (0xfffffffd < (piVar15[2] & 0xfU) - 7)) {
      uVar3 = *(ulong *)(piVar15 + 4);
      uVar4 = *(ulong *)(piVar15 + 6);
      lVar22 = *(long *)((long)pAig->pData + 0x10);
      uVar5 = *(uint *)(uVar3 & 0xfffffffffffffffe);
      in_R8 = (char *)(ulong)uVar5;
      iVar20 = *(int *)((long)pAig->pData + 8);
      lVar25 = (long)iVar20;
      pIVar29 = (Ivy_Supp_t *)(lVar22 + (int)(iVar20 * uVar5));
      iVar8 = *(int *)(uVar4 & 0xfffffffffffffffe);
      pIVar16 = (Ivy_Supp_t *)(lVar22 + iVar8 * iVar20);
      pIVar26 = (Ivy_Supp_t *)(lVar22 + *piVar15 * lVar25);
      *(undefined1 *)(lVar22 + 1 + *piVar15 * lVar25) = 0;
      uVar2 = *(ushort *)(lVar22 + 8 + (long)(int)(iVar20 * uVar5));
      uVar18 = *(ushort *)(lVar22 + 8 + (long)(iVar8 * iVar20));
      if (uVar2 == uVar18) {
        uVar18 = 1;
        if (1 < uVar2) {
          uVar18 = uVar2;
        }
        pIVar26->Delay = uVar18;
      }
      else if ((short)uVar18 < (short)uVar2) {
        pIVar26->Delay = uVar2;
        lVar25 = pAig->pConst1->Id * lVar25;
        pIVar16 = (Ivy_Supp_t *)(lVar22 + lVar25);
        if (uVar4 == 0) {
          iVar8 = 0;
        }
        *(int *)(lVar22 + 0xc + lVar25) = iVar8;
      }
      else {
        pIVar26->Delay = uVar18;
        lVar25 = pAig->pConst1->Id * lVar25;
        pIVar29 = (Ivy_Supp_t *)(lVar22 + lVar25);
        if (uVar3 == 0) {
          uVar5 = 0;
        }
        in_R8 = (char *)(ulong)uVar5;
        *(uint *)(lVar22 + 0xc + lVar25) = uVar5;
      }
      pIVar27 = pIVar16;
      if (pIVar29->nSize < pIVar16->nSize) {
        pIVar27 = pIVar29;
        pIVar29 = pIVar16;
      }
      iVar20 = Ivy_FastMapMerge(pIVar29,pIVar27,pIVar26,nLimit);
      sVar19 = pIVar26->Delay;
      if (iVar20 == 0) {
        sVar19 = sVar19 + 1;
        pIVar26->Delay = sVar19;
        pIVar26->nSize = '\x02';
        iVar20 = 0;
        uVar24 = 0;
        if (*(ulong *)(piVar15 + 4) != 0) {
          uVar24 = *(undefined4 *)(*(ulong *)(piVar15 + 4) & 0xfffffffffffffffe);
        }
        pIVar26[1].nSize = (char)uVar24;
        pIVar26[1].fMark = (char)((uint)uVar24 >> 8);
        pIVar26[1].fMark2 = (char)((uint)uVar24 >> 0x10);
        pIVar26[1].fMark3 = (char)((uint)uVar24 >> 0x18);
        if (*(ulong *)(piVar15 + 6) != 0) {
          iVar20 = *(int *)(*(ulong *)(piVar15 + 6) & 0xfffffffffffffffe);
        }
        pIVar26[1].nRefs = iVar20;
      }
      if (sVar19 < 1) {
        __assert_fail("pSupp->Delay > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFastMap.c"
                      ,0x2b5,"void Ivy_FastMapNode(Ivy_Man_t *, Ivy_Obj_t *, int)");
      }
    }
  }
  uVar5 = Ivy_FastMapDelay(pAig);
  iVar23 = Ivy_FastMapArea(pAig);
  if (fVerbose != 0) {
    aVar17 = Abc_Clock();
    Ivy_FastMapPrint((Ivy_Man_t *)(ulong)uVar5,iVar23,(int)aVar17 - (int)aVar13,0x7c81de,in_R8);
  }
  if (fRecovery != 0) {
    aVar13 = Abc_Clock();
    Ivy_FastMapRequired(pAig,uVar5,fSetInter);
    Ivy_FastMapRecover(pAig,nLimit);
    uVar5 = Ivy_FastMapDelay(pAig);
    iVar23 = Ivy_FastMapArea(pAig);
    if (fVerbose != 0) {
      aVar17 = Abc_Clock();
      Ivy_FastMapPrint((Ivy_Man_t *)(ulong)uVar5,iVar23,(int)aVar17 - (int)aVar13,0x7c81f7,in_R8);
    }
    aVar13 = Abc_Clock();
    Ivy_FastMapRequired(pAig,uVar5,fSetInter_00);
    for (iVar23 = 0; iVar23 < pAig->vObjs->nSize; iVar23 = iVar23 + 1) {
      pIVar14 = (Ivy_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar23);
      if ((pIVar14 != (Ivy_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pIVar14->field_0x8 & 0xf) - 7))
      {
        if (0x20 < nLimit) {
          __assert_fail("nLimit <= 32",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFastMap.c"
                        ,0x1c3,"void Ivy_FastMapNodeArea(Ivy_Man_t *, Ivy_Obj_t *, int)");
        }
        lVar22 = *(long *)((long)pAig->pData + 0x10);
        lVar25 = (long)*(int *)((long)pAig->pData + 8);
        lVar28 = pIVar14->Id * lVar25;
        if (*(char *)(lVar22 + 1 + lVar28) != '\0') {
          __assert_fail("pSupp->fMark == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFastMap.c"
                        ,0x1cc,"void Ivy_FastMapNodeArea(Ivy_Man_t *, Ivy_Obj_t *, int)");
        }
        piVar21 = (int *)((ulong)pIVar14->pFanin0 & 0xfffffffffffffffe);
        piVar15 = (int *)((ulong)pIVar14->pFanin1 & 0xfffffffffffffffe);
        iVar20 = *piVar21;
        iVar8 = *piVar15;
        pIVar29 = (Ivy_Supp_t *)(lVar28 + lVar22);
        if (pIVar29->nRefs == 0) {
          iVar6 = Ivy_FastMapNodeAreaDerefed(pAig,pIVar14);
        }
        else {
          iVar6 = Ivy_FastMapNodeAreaRefed(pAig,pIVar14);
        }
        if (pIVar29->nRefs != 0) {
          Ivy_FastMapNodeDeref(pAig,pIVar14);
        }
        iVar7 = Ivy_FastMapNodeDelay(pAig,pIVar14);
        sVar19 = pIVar29->DelayR;
        if (sVar19 < iVar7) {
          __assert_fail("DelayOld <= pSupp->DelayR",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFastMap.c"
                        ,0x1dc,"void Ivy_FastMapNodeArea(Ivy_Man_t *, Ivy_Obj_t *, int)");
        }
        pIVar26 = (Ivy_Supp_t *)(iVar20 * lVar25 + lVar22);
        pIVar16 = pIVar29 + 1;
        cVar1 = pIVar29->nSize;
        memcpy(Ivy_FastMapNodeArea_Store,pIVar16,(long)(int)cVar1 * 4);
        if ((2 < piVar21[3]) && (pIVar26->Delay < sVar19)) {
          Ivy_FastMapNodeArea_Supp0 = 1;
          if (pIVar14->pFanin0 == (Ivy_Obj_t *)0x0) {
            _DAT_00b5507c = 0;
          }
          else {
            _DAT_00b5507c = *(undefined4 *)((ulong)pIVar14->pFanin0 & 0xfffffffffffffffe);
          }
          pIVar26 = (Ivy_Supp_t *)&Ivy_FastMapNodeArea_Supp0;
        }
        pIVar27 = (Ivy_Supp_t *)(lVar22 + iVar8 * lVar25);
        if ((2 < piVar15[3]) && (pIVar27->Delay < sVar19)) {
          Ivy_FastMapNodeArea_Supp1 = 1;
          if (pIVar14->pFanin1 == (Ivy_Obj_t *)0x0) {
            _DAT_00b5508c = 0;
          }
          else {
            _DAT_00b5508c = *(undefined4 *)((ulong)pIVar14->pFanin1 & 0xfffffffffffffffe);
          }
          pIVar27 = (Ivy_Supp_t *)&Ivy_FastMapNodeArea_Supp1;
        }
        pSupp1 = pIVar27;
        if (pIVar26->nSize < pIVar27->nSize) {
          pSupp1 = pIVar26;
          pIVar26 = pIVar27;
        }
        _Ivy_FastMapNodeArea_StoreSize = (int)cVar1;
        iVar20 = Ivy_FastMapMerge(pIVar26,pSupp1,pIVar29,nLimit);
        if (iVar20 == 0) {
          pIVar29->nSize = '\x02';
          iVar20 = 0;
          uVar24 = 0;
          if (pIVar14->pFanin0 != (Ivy_Obj_t *)0x0) {
            uVar24 = *(undefined4 *)((ulong)pIVar14->pFanin0 & 0xfffffffffffffffe);
          }
          pIVar16->nSize = (char)uVar24;
          pIVar16->fMark = (char)((uint)uVar24 >> 8);
          pIVar16->fMark2 = (char)((uint)uVar24 >> 0x10);
          pIVar16->fMark3 = (char)((uint)uVar24 >> 0x18);
          if (pIVar14->pFanin1 != (Ivy_Obj_t *)0x0) {
            iVar20 = *(int *)((ulong)pIVar14->pFanin1 & 0xfffffffffffffffe);
          }
          pIVar29[1].nRefs = iVar20;
        }
        iVar20 = Ivy_FastMapNodeDelay(pAig,pIVar14);
        pIVar29->Delay = (short)iVar20;
        iVar20 = pIVar29->nRefs;
        pIVar29->nRefs = 0;
        iVar8 = Ivy_FastMapNodeAreaDerefed(pAig,pIVar14);
        pIVar29->nRefs = iVar20;
        if ((iVar6 < iVar8) || (pIVar29->DelayR < pIVar29->Delay)) {
          lVar22 = (long)Ivy_FastMapNodeArea_StoreSize;
          pIVar29->nSize = Ivy_FastMapNodeArea_StoreSize;
          memcpy(pIVar16,Ivy_FastMapNodeArea_Store,lVar22 << 2);
          pIVar29->Delay = (short)iVar7;
        }
        if (iVar20 != 0) {
          Ivy_FastMapNodeRef(pAig,pIVar14);
        }
      }
    }
    uVar5 = Ivy_FastMapDelay(pAig);
    iVar23 = Ivy_FastMapArea(pAig);
    if (fVerbose != 0) {
      aVar17 = Abc_Clock();
      Ivy_FastMapPrint((Ivy_Man_t *)(ulong)uVar5,iVar23,(int)aVar17 - (int)aVar13,0x7c8210,in_R8);
    }
    aVar13 = Abc_Clock();
    Ivy_FastMapRequired(pAig,uVar5,fSetInter_01);
    Ivy_FastMapRecover(pAig,nLimit);
    uVar5 = Ivy_FastMapDelay(pAig);
    iVar23 = Ivy_FastMapArea(pAig);
    if (fVerbose != 0) {
      aVar17 = Abc_Clock();
      Ivy_FastMapPrint((Ivy_Man_t *)(ulong)uVar5,iVar23,(int)aVar17 - (int)aVar13,0x7c81f7,in_R8);
    }
  }
  aVar13 = Abc_Clock();
  s_MappingTime = aVar13 - aVar9;
  s_MappingMem = piVar10[2] * piVar10[1];
  return;
}

Assistant:

void Ivy_FastMapPerform( Ivy_Man_t * pAig, int nLimit, int fRecovery, int fVerbose )
{
    Ivy_SuppMan_t * pMan;
    Ivy_Obj_t * pObj;
    int i, Delay, Area;
    abctime clk, clkTotal = Abc_Clock();
    // start the memory for supports
    pMan = ABC_ALLOC( Ivy_SuppMan_t, 1 );
    memset( pMan, 0, sizeof(Ivy_SuppMan_t) );
    pMan->nLimit = nLimit;
    pMan->nObjs  = Ivy_ManObjIdMax(pAig) + 1;
    pMan->nSize  = sizeof(Ivy_Supp_t) + nLimit * sizeof(int);
    pMan->pMem   = (char *)ABC_ALLOC( char, pMan->nObjs * pMan->nSize );
    memset( pMan->pMem, 0, pMan->nObjs * pMan->nSize );
    pMan->vLuts  = Vec_VecAlloc( 100 );
    pAig->pData  = pMan;
clk = Abc_Clock();
    // set the PI mapping
    Ivy_ObjSuppStart( pAig, Ivy_ManConst1(pAig) );
    Ivy_ManForEachPi( pAig, pObj, i )
        Ivy_ObjSuppStart( pAig, pObj );
    // iterate through all nodes in the topological order
    Ivy_ManForEachNode( pAig, pObj, i )
        Ivy_FastMapNode( pAig, pObj, nLimit );
    // find the best arrival time and area
    Delay = Ivy_FastMapDelay( pAig );
    Area = Ivy_FastMapArea(pAig);
    if ( fVerbose )
        Ivy_FastMapPrint( pAig, Delay, Area, Abc_Clock() - clk, "Delay oriented mapping: " );

// 2-1-2 (doing 2-1-2-1-2 improves 0.5%)

    if ( fRecovery )
    {
clk = Abc_Clock();
    Ivy_FastMapRequired( pAig, Delay, 0 );
    // remap the nodes
    Ivy_FastMapRecover( pAig, nLimit );
    Delay = Ivy_FastMapDelay( pAig );
    Area = Ivy_FastMapArea(pAig);
    if ( fVerbose )
        Ivy_FastMapPrint( pAig, Delay, Area, Abc_Clock() - clk, "Area recovery 2       : " );

clk = Abc_Clock();
    Ivy_FastMapRequired( pAig, Delay, 0 );
    // iterate through all nodes in the topological order
    Ivy_ManForEachNode( pAig, pObj, i )
        Ivy_FastMapNodeArea( pAig, pObj, nLimit );
    Delay = Ivy_FastMapDelay( pAig );
    Area = Ivy_FastMapArea(pAig);
    if ( fVerbose )
        Ivy_FastMapPrint( pAig, Delay, Area, Abc_Clock() - clk, "Area recovery 1       : " );

clk = Abc_Clock();
    Ivy_FastMapRequired( pAig, Delay, 0 );
    // remap the nodes
    Ivy_FastMapRecover( pAig, nLimit );
    Delay = Ivy_FastMapDelay( pAig );
    Area = Ivy_FastMapArea(pAig);
    if ( fVerbose )
        Ivy_FastMapPrint( pAig, Delay, Area, Abc_Clock() - clk, "Area recovery 2       : " );
    }


    s_MappingTime = Abc_Clock() - clkTotal;
    s_MappingMem = pMan->nObjs * pMan->nSize;
/*
    {
        Vec_Ptr_t * vNodes;
        vNodes = Vec_PtrAlloc( 100 );
        Vec_VecForEachEntry( Ivy_Obj_t *, pMan->vLuts, pObj, i, k )
            Vec_PtrPush( vNodes, pObj );
        Ivy_ManShow( pAig, 0, vNodes );
        Vec_PtrFree( vNodes );
    }
*/
}